

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

int csp_conn_enqueue_packet(csp_conn_t *conn,csp_packet_t *packet)

{
  int iVar1;
  void *in_RSI;
  csp_queue_handle_t in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (csp_queue_handle_t)0x0) {
    local_4 = -2;
  }
  else {
    iVar1 = csp_queue_enqueue(in_RDI,in_RSI,0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int csp_conn_enqueue_packet(csp_conn_t * conn, csp_packet_t * packet) {

	if (!conn)
		return CSP_ERR_INVAL;

	if (csp_queue_enqueue(conn->rx_queue, &packet, 0) != CSP_QUEUE_OK) {
		csp_dbg_conn_ovf++;
		return CSP_ERR_NOMEM;
	}

	return CSP_ERR_NONE;
}